

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O3

bool __thiscall ZAP::Archive::getRawData(Archive *this,Entry *entry,char **data,size_t *size)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  
  if (entry == (Entry *)0x0) {
    return false;
  }
  bVar3 = entry->compressed_size != 0;
  if (bVar3) {
    std::istream::seekg(this->stream,entry->index,0);
    uVar1 = entry->compressed_size;
    *size = (ulong)uVar1;
    pcVar2 = (char *)operator_new__((ulong)uVar1);
    *data = pcVar2;
    std::istream::read((char *)this->stream,(long)pcVar2);
  }
  return bVar3;
}

Assistant:

bool Archive::getRawData(const Entry *entry, char *&data, std::size_t &size) const
	{
		if (entry == nullptr)
			return false;

		if (entry->compressed_size == 0)
			return false;

		stream->seekg(entry->index);

		size = entry->compressed_size;
		data = new char[entry->compressed_size];
		stream->read(data, entry->compressed_size);
		return true;
	}